

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

SceneObject * __thiscall
CMU462::DynamicScene::Mesh::get_transformed_static_object(Mesh *this,double t)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  pointer pVVar4;
  Mesh *this_00;
  reference pvVar5;
  pointer pVVar6;
  size_type __n;
  _Self local_590;
  _Self local_588;
  VertexIter v_1;
  int i;
  SceneObject *output;
  Vector4D local_568;
  Vector3D local_548;
  Vector3D local_530;
  double local_518;
  Vector3D local_510;
  Vector3D local_4f8;
  undefined1 local_4e0 [8];
  Vector4D tmp;
  _Self local_4b8;
  VertexIter v;
  undefined1 local_430 [8];
  Matrix4x4 transform;
  undefined1 local_398 [8];
  Matrix4x4 T;
  int j;
  int i_2;
  Matrix4x4 R_homogeneous;
  undefined1 local_248 [8];
  Matrix3x3 R;
  undefined1 local_1f8 [8];
  Matrix3x3 Rz;
  undefined1 local_1a8 [8];
  Matrix3x3 Ry;
  undefined1 local_158 [8];
  Matrix3x3 Rx;
  undefined1 local_108 [4];
  int i_1;
  Matrix4x4 S;
  Vector3D scale;
  Vector3D rotate;
  undefined1 local_48 [8];
  Vector3D position;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  double t_local;
  Mesh *this_local;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&position.z);
  Spline<CMU462::Vector3D>::operator()((Vector3D *)local_48,&(this->super_SceneObject).positions,t);
  Spline<CMU462::Vector3D>::operator()((Vector3D *)&scale.z,&(this->super_SceneObject).rotations,t);
  Spline<CMU462::Vector3D>::operator()
            ((Vector3D *)&S.entries[3].w,&(this->super_SceneObject).scales,t);
  Matrix4x4::identity();
  for (Rx.entries[2].z._4_4_ = 0; Rx.entries[2].z._4_4_ < 3;
      Rx.entries[2].z._4_4_ = Rx.entries[2].z._4_4_ + 1) {
    pdVar3 = Vector3D::operator[]((Vector3D *)&S.entries[3].w,(int *)((long)&Rx.entries[2].z + 4));
    dVar1 = *pdVar3;
    pdVar3 = Matrix4x4::operator()
                       ((Matrix4x4 *)local_108,Rx.entries[2].z._4_4_,Rx.entries[2].z._4_4_);
    *pdVar3 = dVar1;
  }
  Ry.entries[2].z._4_4_ = 0;
  pdVar3 = Vector3D::operator[]((Vector3D *)&scale.z,(int *)((long)&Ry.entries[2].z + 4));
  rotateMatrix((Matrix3x3 *)local_158,1.0,0.0,0.0,(float)*pdVar3);
  Rz.entries[2].z._4_4_ = 1;
  pdVar3 = Vector3D::operator[]((Vector3D *)&scale.z,(int *)((long)&Rz.entries[2].z + 4));
  rotateMatrix((Matrix3x3 *)local_1a8,0.0,1.0,0.0,(float)*pdVar3);
  R.entries[2].z._4_4_ = 2;
  pdVar3 = Vector3D::operator[]((Vector3D *)&scale.z,(int *)((long)&R.entries[2].z + 4));
  rotateMatrix((Matrix3x3 *)local_1f8,0.0,0.0,1.0,(float)*pdVar3);
  Matrix3x3::operator*
            ((Matrix3x3 *)&R_homogeneous.entries[3].w,(Matrix3x3 *)local_158,(Matrix3x3 *)local_1a8)
  ;
  Matrix3x3::operator*
            ((Matrix3x3 *)local_248,(Matrix3x3 *)&R_homogeneous.entries[3].w,(Matrix3x3 *)local_1f8)
  ;
  Matrix4x4::identity();
  for (T.entries[3].w._4_4_ = 0; T.entries[3].w._4_4_ < 3;
      T.entries[3].w._4_4_ = T.entries[3].w._4_4_ + 1) {
    for (T.entries[3].w._0_4_ = 0; T.entries[3].w._0_4_ < 3;
        T.entries[3].w._0_4_ = T.entries[3].w._0_4_ + 1) {
      pdVar3 = Matrix3x3::operator()
                         ((Matrix3x3 *)local_248,T.entries[3].w._4_4_,T.entries[3].w._0_4_);
      dVar1 = *pdVar3;
      pdVar3 = Matrix4x4::operator()((Matrix4x4 *)&j,T.entries[3].w._4_4_,T.entries[3].w._0_4_);
      *pdVar3 = dVar1;
    }
  }
  Vector3D::Vector3D((Vector3D *)&transform.entries[3].w,(Vector3D *)local_48);
  Matrix4x4::translation((Matrix4x4 *)local_398,(Vector3D *)&transform.entries[3].w);
  Matrix4x4::operator*((Matrix4x4 *)&v,(Matrix4x4 *)local_398,(Matrix4x4 *)&j);
  Matrix4x4::operator*((Matrix4x4 *)local_430,(Matrix4x4 *)&v,(Matrix4x4 *)local_108);
  local_4b8._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
  while( true ) {
    tmp.w = (double)HalfedgeMesh::verticesEnd(&this->mesh);
    bVar2 = std::operator!=(&local_4b8,(_Self *)&tmp.w);
    if (!bVar2) break;
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_4b8);
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&position.z,
               &pVVar6->position);
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_4b8);
    pVVar4 = std::_List_iterator<CMU462::Vertex>::operator->(&local_4b8);
    local_518 = (double)pVVar4->offset;
    pVVar4 = std::_List_iterator<CMU462::Vertex>::operator->(&local_4b8);
    Vertex::normal(&local_530,pVVar4);
    CMU462::operator*(&local_510,&local_518,&local_530);
    Vector3D::operator+(&local_4f8,&pVVar6->position,&local_510);
    Vector4D::Vector4D((Vector4D *)local_4e0,&local_4f8,1.0);
    Matrix4x4::operator*(&local_568,(Matrix4x4 *)local_430,(Vector4D *)local_4e0);
    Vector4D::to3D(&local_548,&local_568);
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_4b8);
    (pVVar6->position).x = local_548.x;
    (pVVar6->position).y = local_548.y;
    (pVVar6->position).z = local_548.z;
    std::_List_iterator<CMU462::Vertex>::operator++(&local_4b8,0);
  }
  this_00 = (Mesh *)operator_new(0x38);
  StaticScene::Mesh::Mesh(this_00,&this->mesh,this->bsdf);
  v_1._M_node._4_4_ = 0;
  local_588._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
  while( true ) {
    local_590._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(&this->mesh);
    bVar2 = std::operator!=(&local_588,&local_590);
    if (!bVar2) break;
    __n = (size_type)v_1._M_node._4_4_;
    v_1._M_node._4_4_ = v_1._M_node._4_4_ + 1;
    pvVar5 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&position.z,
                        __n);
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_588);
    (pVVar6->position).x = pvVar5->x;
    (pVVar6->position).y = pvVar5->y;
    (pVVar6->position).z = pvVar5->z;
    std::_List_iterator<CMU462::Vertex>::operator++(&local_588,0);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&position.z);
  return &this_00->super_SceneObject;
}

Assistant:

StaticScene::SceneObject *Mesh::get_transformed_static_object(double t) {
  vector<Vector3D> originalPositions;

  Vector3D position = positions(t);
  Vector3D rotate = rotations(t);
  Vector3D scale = scales(t);

  Matrix4x4 S = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) S(i,i) = scale[i];

  Matrix3x3 Rx = rotateMatrix(1, 0, 0, rotate[0]);
  Matrix3x3 Ry = rotateMatrix(0, 1, 0, rotate[1]);
  Matrix3x3 Rz = rotateMatrix(0, 0, 1, rotate[2]);

  Matrix3x3 R = Rx * Ry * Rz;
  Matrix4x4 R_homogeneous = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R_homogeneous(i,j) = R(i,j);
    }
  }

  Matrix4x4 T = Matrix4x4::translation(position);

  Matrix4x4 transform = T * R_homogeneous * S;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector4D tmp = Vector4D(v->position + v->offset * v->normal(), 1.0);
    v->position = (transform * tmp).to3D();
  }

  StaticScene::SceneObject *output = new StaticScene::Mesh(mesh, bsdf);

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }

  return output;
}